

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall
leveldb::MemTable::Add(MemTable *this,SequenceNumber s,ValueType type,Slice *key,Slice *value)

{
  size_t __n;
  size_t v;
  char *pcVar1;
  char *pcVar2;
  char *__src;
  Slice *in_RCX;
  uint in_EDX;
  long in_RSI;
  Slice *in_R8;
  char *p;
  char *buf;
  size_t encoded_len;
  size_t internal_key_size;
  size_t val_size;
  size_t key_size;
  size_t in_stack_ffffffffffffff90;
  Arena *in_stack_ffffffffffffff98;
  
  __n = Slice::size(in_RCX);
  v = Slice::size(in_R8);
  VarintLength(__n + 8);
  VarintLength(v);
  pcVar1 = Arena::Allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  pcVar2 = EncodeVarint32(pcVar1,(uint32_t)(__n + 8));
  pcVar1 = pcVar2;
  __src = Slice::data(in_RCX);
  memcpy(pcVar1,__src,__n);
  EncodeFixed64(pcVar2 + __n,in_RSI << 8 | (ulong)in_EDX);
  pcVar1 = EncodeVarint32(pcVar2 + __n + 8,(uint32_t)v);
  pcVar2 = Slice::data(in_R8);
  memcpy(pcVar1,pcVar2,v);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert
            ((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)buf,(char **)p);
  return;
}

Assistant:

void MemTable::Add(SequenceNumber s, ValueType type, const Slice& key,
                   const Slice& value) {
  // Format of an entry is concatenation of:
  //  key_size     : varint32 of internal_key.size()
  //  key bytes    : char[internal_key.size()]
  //  value_size   : varint32 of value.size()
  //  value bytes  : char[value.size()]
  size_t key_size = key.size();
  size_t val_size = value.size();
  size_t internal_key_size = key_size + 8;
  const size_t encoded_len = VarintLength(internal_key_size) +
                             internal_key_size + VarintLength(val_size) +
                             val_size;
  char* buf = arena_.Allocate(encoded_len);
  char* p = EncodeVarint32(buf, internal_key_size);
  memcpy(p, key.data(), key_size);
  p += key_size;
  EncodeFixed64(p, (s << 8) | type);
  p += 8;
  p = EncodeVarint32(p, val_size);
  memcpy(p, value.data(), val_size);
  assert(p + val_size == buf + encoded_len);
  table_.Insert(buf);
}